

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

int __thiscall
leveldb::Version::PickLevelForMemTableOutput
          (Version *this,Slice *smallest_user_key,Slice *largest_user_key)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long in_FS_OFFSET;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> overlaps;
  InternalKey limit;
  InternalKey start;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> local_98;
  InternalKey local_78;
  InternalKey local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = 0;
  bVar2 = SomeFileOverlapsRange
                    (&this->vset_->icmp_,false,this->files_,smallest_user_key,largest_user_key);
  if (!bVar2) {
    InternalKey::InternalKey(&local_58,smallest_user_key,0xffffffffffffff,kTypeValue);
    InternalKey::InternalKey(&local_78,largest_user_key,0,kTypeDeletion);
    local_98.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar7 = 0;
    do {
      lVar1 = lVar7 + 1;
      bVar2 = SomeFileOverlapsRange
                        (&this->vset_->icmp_,true,this->files_ + lVar1,smallest_user_key,
                         largest_user_key);
      if (bVar2) goto LAB_0066ad66;
      GetOverlappingInputs(this,(uint)lVar7 | 2,&local_58,&local_78,&local_98);
      if ((long)local_98.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_98.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start == 0) {
        lVar4 = 0;
      }
      else {
        lVar3 = (long)local_98.
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_98.
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3;
        lVar5 = 0;
        lVar4 = 0;
        do {
          lVar4 = lVar4 + local_98.
                          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar5]->file_size;
          lVar5 = lVar5 + 1;
        } while (lVar3 + (ulong)(lVar3 == 0) != lVar5);
      }
      if ((long)(this->vset_->options_->max_file_size * 10) < lVar4) goto LAB_0066ad66;
      lVar7 = lVar1;
    } while (lVar1 != 2);
    lVar7 = 2;
LAB_0066ad66:
    iVar6 = (int)lVar7;
    if (local_98.
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.
                            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.
                            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.rep_._M_dataplus._M_p != &local_78.rep_.field_2) {
      operator_delete(local_78.rep_._M_dataplus._M_p,local_78.rep_.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.rep_._M_dataplus._M_p != &local_58.rep_.field_2) {
      operator_delete(local_58.rep_._M_dataplus._M_p,local_58.rep_.field_2._M_allocated_capacity + 1
                     );
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

int Version::PickLevelForMemTableOutput(const Slice& smallest_user_key,
                                        const Slice& largest_user_key) {
  int level = 0;
  if (!OverlapInLevel(0, &smallest_user_key, &largest_user_key)) {
    // Push to next level if there is no overlap in next level,
    // and the #bytes overlapping in the level after that are limited.
    InternalKey start(smallest_user_key, kMaxSequenceNumber, kValueTypeForSeek);
    InternalKey limit(largest_user_key, 0, static_cast<ValueType>(0));
    std::vector<FileMetaData*> overlaps;
    while (level < config::kMaxMemCompactLevel) {
      if (OverlapInLevel(level + 1, &smallest_user_key, &largest_user_key)) {
        break;
      }
      if (level + 2 < config::kNumLevels) {
        // Check that file does not overlap too many grandparent bytes.
        GetOverlappingInputs(level + 2, &start, &limit, &overlaps);
        const int64_t sum = TotalFileSize(overlaps);
        if (sum > MaxGrandParentOverlapBytes(vset_->options_)) {
          break;
        }
      }
      level++;
    }
  }
  return level;
}